

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

Arg * __thiscall
fmt::internal::PrintfFormatter<wchar_t>::get_arg
          (Arg *__return_storage_ptr__,PrintfFormatter<wchar_t> *this,wchar_t *s,uint arg_index)

{
  FormatError *this_00;
  char *local_68;
  CStringRef local_30;
  char *local_28;
  char *error;
  wchar_t *pwStack_18;
  uint arg_index_local;
  wchar_t *s_local;
  PrintfFormatter<wchar_t> *this_local;
  
  local_28 = (char *)0x0;
  error._4_4_ = arg_index;
  pwStack_18 = s;
  s_local = (wchar_t *)this;
  if (arg_index == 0xffffffff) {
    FormatterBase::next_arg(__return_storage_ptr__,(FormatterBase *)this,&local_28);
  }
  else {
    FormatterBase::get_arg(__return_storage_ptr__,(FormatterBase *)this,arg_index - 1,&local_28);
  }
  if (local_28 != (char *)0x0) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    if (*pwStack_18 == L'\0') {
      local_68 = "invalid format string";
    }
    else {
      local_68 = local_28;
    }
    BasicCStringRef<char>::BasicCStringRef(&local_30,local_68);
    FormatError::FormatError(this_00,local_30);
    __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return __return_storage_ptr__;
}

Assistant:

Arg fmt::internal::PrintfFormatter<Char>::get_arg(
    const Char *s, unsigned arg_index) {
  (void)s;
  const char *error = 0;
  Arg arg = arg_index == UINT_MAX ?
    next_arg(error) : FormatterBase::get_arg(arg_index - 1, error);
  if (error)
    FMT_THROW(FormatError(!*s ? "invalid format string" : error));
  return arg;
}